

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void UYVYToYRow_C(uint8_t *src_uyvy,uint8_t *dst_y,int width)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 < (long)width + -1; lVar1 = lVar1 + 2) {
    dst_y[lVar1] = src_uyvy[lVar1 * 2 + 1];
    dst_y[lVar1 + 1] = src_uyvy[lVar1 * 2 + 3];
  }
  if ((width & 1U) != 0) {
    dst_y[(long)width + -1] = src_uyvy[lVar1 * 2 + 1];
  }
  return;
}

Assistant:

void UYVYToYRow_C(const uint8_t* src_uyvy, uint8_t* dst_y, int width) {
  // Output a row of Y values.
  int x;
  for (x = 0; x < width - 1; x += 2) {
    dst_y[x] = src_uyvy[1];
    dst_y[x + 1] = src_uyvy[3];
    src_uyvy += 4;
  }
  if (width & 1) {
    dst_y[width - 1] = src_uyvy[1];
  }
}